

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void av1_extend_frame(uint8_t *data,int width,int height,int stride,int border_horz,int border_vert,
                     int highbd)

{
  undefined2 *puVar1;
  undefined2 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  size_t __n;
  uint8_t *puVar17;
  void *__src;
  long lVar18;
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  byte *pbVar23;
  ulong uVar24;
  void *pvVar25;
  long lVar26;
  long lVar27;
  int iVar29;
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  int iVar45;
  int iVar57;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar58;
  int iVar64;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM14 [16];
  
  auVar15 = _DAT_004c80b0;
  auVar14 = _DAT_004c80a0;
  auVar13 = _DAT_004c8090;
  auVar12 = _DAT_004c8080;
  auVar11 = _DAT_004c8070;
  if (highbd == 0) {
    lVar27 = (long)stride;
    sVar19 = (size_t)border_horz;
    if (0 < height) {
      uVar21 = (ulong)(uint)height;
      pbVar23 = data;
      do {
        memset(pbVar23 + -sVar19,(uint)*pbVar23,sVar19);
        memset(pbVar23 + width,(uint)pbVar23[(long)width + -1],sVar19);
        pbVar23 = pbVar23 + lVar27;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    if (0 < border_vert) {
      __n = (size_t)(width + border_horz * 2);
      lVar16 = -(long)border_vert;
      puVar17 = data + -(border_vert * lVar27 + sVar19);
      do {
        lVar16 = lVar16 + 1;
        memcpy(puVar17,data + -sVar19,__n);
        puVar17 = puVar17 + lVar27;
      } while ((int)lVar16 != 0);
      lVar16 = (long)height;
      puVar17 = data + (lVar27 * lVar16 - sVar19);
      do {
        memcpy(puVar17,data + -sVar19 + (height + -1) * lVar27,__n);
        lVar16 = lVar16 + 1;
        puVar17 = puVar17 + lVar27;
      } while (lVar16 < border_vert + height);
    }
  }
  else {
    lVar27 = (long)data * 2;
    lVar16 = (long)stride;
    if (0 < height) {
      lVar20 = (long)width;
      lVar22 = (long)(border_horz + width);
      if ((long)(border_horz + width) < lVar20 + 1) {
        lVar22 = lVar20 + 1;
      }
      lVar18 = (ulong)(uint)border_horz - 1;
      auVar28._8_4_ = (int)lVar18;
      auVar28._0_8_ = lVar18;
      auVar28._12_4_ = (int)((ulong)lVar18 >> 0x20);
      lVar18 = (lVar22 - lVar20) + -1;
      auVar31._8_4_ = (int)lVar18;
      auVar31._0_8_ = lVar18;
      auVar31._12_4_ = (int)((ulong)lVar18 >> 0x20);
      lVar18 = lVar27 + (long)-border_horz * 2 + 0xe;
      lVar26 = lVar27 + lVar20 * 2 + 0xe;
      uVar21 = 0;
      auVar28 = auVar28 ^ _DAT_004c80b0;
      do {
        if (0 < border_horz) {
          puVar1 = (undefined2 *)(lVar27 + uVar21 * lVar16 * 2);
          uVar2 = *puVar1;
          uVar24 = 0;
          do {
            auVar43._8_4_ = (int)uVar24;
            auVar43._0_8_ = uVar24;
            auVar43._12_4_ = (int)(uVar24 >> 0x20);
            auVar35 = (auVar43 | auVar14) ^ auVar15;
            iVar45 = auVar28._0_4_;
            iVar58 = -(uint)(iVar45 < auVar35._0_4_);
            iVar29 = auVar28._4_4_;
            auVar36._4_4_ = -(uint)(iVar29 < auVar35._4_4_);
            iVar57 = auVar28._8_4_;
            iVar64 = -(uint)(iVar57 < auVar35._8_4_);
            iVar30 = auVar28._12_4_;
            auVar36._12_4_ = -(uint)(iVar30 < auVar35._12_4_);
            auVar47._4_4_ = iVar58;
            auVar47._0_4_ = iVar58;
            auVar47._8_4_ = iVar64;
            auVar47._12_4_ = iVar64;
            auVar65 = pshuflw(in_XMM12,auVar47,0xe8);
            auVar38._4_4_ = -(uint)(auVar35._4_4_ == iVar29);
            auVar38._12_4_ = -(uint)(auVar35._12_4_ == iVar30);
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar68 = pshuflw(in_XMM13,auVar38,0xe8);
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar66 = pshuflw(auVar65,auVar36,0xe8);
            auVar35._8_4_ = 0xffffffff;
            auVar35._0_8_ = 0xffffffffffffffff;
            auVar35._12_4_ = 0xffffffff;
            auVar35 = (auVar66 | auVar68 & auVar65) ^ auVar35;
            auVar35 = packssdw(auVar35,auVar35);
            if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar18 + -0xe + uVar24 * 2) = uVar2;
            }
            auVar36 = auVar38 & auVar47 | auVar36;
            auVar35 = packssdw(auVar36,auVar36);
            auVar66._8_4_ = 0xffffffff;
            auVar66._0_8_ = 0xffffffffffffffff;
            auVar66._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar66,auVar35 ^ auVar66);
            if ((auVar35._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(lVar18 + -0xc + uVar24 * 2) = uVar2;
            }
            auVar35 = (auVar43 | auVar13) ^ auVar15;
            iVar58 = -(uint)(iVar45 < auVar35._0_4_);
            auVar59._4_4_ = -(uint)(iVar29 < auVar35._4_4_);
            iVar64 = -(uint)(iVar57 < auVar35._8_4_);
            auVar59._12_4_ = -(uint)(iVar30 < auVar35._12_4_);
            auVar37._4_4_ = iVar58;
            auVar37._0_4_ = iVar58;
            auVar37._8_4_ = iVar64;
            auVar37._12_4_ = iVar64;
            auVar46._4_4_ = -(uint)(auVar35._4_4_ == iVar29);
            auVar46._12_4_ = -(uint)(auVar35._12_4_ == iVar30);
            auVar46._0_4_ = auVar46._4_4_;
            auVar46._8_4_ = auVar46._12_4_;
            auVar59._0_4_ = auVar59._4_4_;
            auVar59._8_4_ = auVar59._12_4_;
            auVar35 = auVar46 & auVar37 | auVar59;
            auVar35 = packssdw(auVar35,auVar35);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar3,auVar35 ^ auVar3);
            if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar18 + -10 + uVar24 * 2) = uVar2;
            }
            auVar38 = pshufhw(auVar37,auVar37,0x84);
            auVar47 = pshufhw(auVar46,auVar46,0x84);
            auVar36 = pshufhw(auVar38,auVar59,0x84);
            auVar39._8_4_ = 0xffffffff;
            auVar39._0_8_ = 0xffffffffffffffff;
            auVar39._12_4_ = 0xffffffff;
            auVar39 = (auVar36 | auVar47 & auVar38) ^ auVar39;
            auVar38 = packssdw(auVar39,auVar39);
            if ((auVar38 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar18 + -8 + uVar24 * 2) = uVar2;
            }
            auVar38 = (auVar43 | auVar12) ^ auVar15;
            iVar58 = -(uint)(iVar45 < auVar38._0_4_);
            auVar41._4_4_ = -(uint)(iVar29 < auVar38._4_4_);
            iVar64 = -(uint)(iVar57 < auVar38._8_4_);
            auVar41._12_4_ = -(uint)(iVar30 < auVar38._12_4_);
            auVar48._4_4_ = iVar58;
            auVar48._0_4_ = iVar58;
            auVar48._8_4_ = iVar64;
            auVar48._12_4_ = iVar64;
            auVar35 = pshuflw(auVar35,auVar48,0xe8);
            auVar40._4_4_ = -(uint)(auVar38._4_4_ == iVar29);
            auVar40._12_4_ = -(uint)(auVar38._12_4_ == iVar30);
            auVar40._0_4_ = auVar40._4_4_;
            auVar40._8_4_ = auVar40._12_4_;
            auVar38 = pshuflw(auVar68 & auVar65,auVar40,0xe8);
            in_XMM13 = auVar38 & auVar35;
            auVar41._0_4_ = auVar41._4_4_;
            auVar41._8_4_ = auVar41._12_4_;
            auVar35 = pshuflw(auVar35,auVar41,0xe8);
            auVar65._8_4_ = 0xffffffff;
            auVar65._0_8_ = 0xffffffffffffffff;
            auVar65._12_4_ = 0xffffffff;
            auVar65 = (auVar35 | in_XMM13) ^ auVar65;
            in_XMM12 = packssdw(auVar65,auVar65);
            if ((in_XMM12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar18 + -6 + uVar24 * 2) = uVar2;
            }
            auVar41 = auVar40 & auVar48 | auVar41;
            auVar35 = packssdw(auVar41,auVar41);
            auVar68._8_4_ = 0xffffffff;
            auVar68._0_8_ = 0xffffffffffffffff;
            auVar68._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar68,auVar35 ^ auVar68);
            if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar18 + -4 + uVar24 * 2) = uVar2;
            }
            auVar35 = (auVar43 | auVar11) ^ auVar15;
            iVar45 = -(uint)(iVar45 < auVar35._0_4_);
            auVar49._4_4_ = -(uint)(iVar29 < auVar35._4_4_);
            iVar57 = -(uint)(iVar57 < auVar35._8_4_);
            auVar49._12_4_ = -(uint)(iVar30 < auVar35._12_4_);
            auVar42._4_4_ = iVar45;
            auVar42._0_4_ = iVar45;
            auVar42._8_4_ = iVar57;
            auVar42._12_4_ = iVar57;
            auVar32._4_4_ = -(uint)(auVar35._4_4_ == iVar29);
            auVar32._12_4_ = -(uint)(auVar35._12_4_ == iVar30);
            auVar32._0_4_ = auVar32._4_4_;
            auVar32._8_4_ = auVar32._12_4_;
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar35 = auVar32 & auVar42 | auVar49;
            auVar35 = packssdw(auVar35,auVar35);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar4,auVar35 ^ auVar4);
            if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar18 + -2 + uVar24 * 2) = uVar2;
            }
            auVar43 = pshufhw(auVar42,auVar42,0x84);
            auVar35 = pshufhw(auVar32,auVar32,0x84);
            auVar38 = pshufhw(auVar43,auVar49,0x84);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 & auVar43,(auVar38 | auVar35 & auVar43) ^ auVar5);
            if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar18 + uVar24 * 2) = uVar2;
            }
            uVar24 = uVar24 + 8;
          } while ((border_horz + 7U & 0xfffffff8) != uVar24);
          uVar2 = puVar1[lVar20 + -1];
          uVar24 = 0;
          do {
            auVar33._8_4_ = (int)uVar24;
            auVar33._0_8_ = uVar24;
            auVar33._12_4_ = (int)(uVar24 >> 0x20);
            auVar35 = auVar31 ^ auVar15;
            auVar43 = (auVar33 | auVar14) ^ auVar15;
            iVar45 = auVar35._0_4_;
            iVar58 = -(uint)(iVar45 < auVar43._0_4_);
            iVar29 = auVar35._4_4_;
            auVar51._4_4_ = -(uint)(iVar29 < auVar43._4_4_);
            iVar57 = auVar35._8_4_;
            iVar64 = -(uint)(iVar57 < auVar43._8_4_);
            iVar30 = auVar35._12_4_;
            auVar51._12_4_ = -(uint)(iVar30 < auVar43._12_4_);
            auVar60._4_4_ = iVar58;
            auVar60._0_4_ = iVar58;
            auVar60._8_4_ = iVar64;
            auVar60._12_4_ = iVar64;
            auVar35 = pshuflw(in_XMM13,auVar60,0xe8);
            auVar50._4_4_ = -(uint)(auVar43._4_4_ == iVar29);
            auVar50._12_4_ = -(uint)(auVar43._12_4_ == iVar30);
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar38 = pshuflw(in_XMM14,auVar50,0xe8);
            auVar51._0_4_ = auVar51._4_4_;
            auVar51._8_4_ = auVar51._12_4_;
            auVar43 = pshuflw(auVar35,auVar51,0xe8);
            auVar69._8_4_ = 0xffffffff;
            auVar69._0_8_ = 0xffffffffffffffff;
            auVar69._12_4_ = 0xffffffff;
            auVar69 = (auVar43 | auVar38 & auVar35) ^ auVar69;
            auVar43 = packssdw(auVar69,auVar69);
            if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar26 + -0xe + uVar24 * 2) = uVar2;
            }
            auVar51 = auVar50 & auVar60 | auVar51;
            auVar43 = packssdw(auVar51,auVar51);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar43 = packssdw(auVar43 ^ auVar6,auVar43 ^ auVar6);
            if ((auVar43._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(lVar26 + -0xc + uVar24 * 2) = uVar2;
            }
            auVar43 = (auVar33 | auVar13) ^ auVar15;
            iVar58 = -(uint)(iVar45 < auVar43._0_4_);
            auVar67._4_4_ = -(uint)(iVar29 < auVar43._4_4_);
            iVar64 = -(uint)(iVar57 < auVar43._8_4_);
            auVar67._12_4_ = -(uint)(iVar30 < auVar43._12_4_);
            auVar52._4_4_ = iVar58;
            auVar52._0_4_ = iVar58;
            auVar52._8_4_ = iVar64;
            auVar52._12_4_ = iVar64;
            auVar61._4_4_ = -(uint)(auVar43._4_4_ == iVar29);
            auVar61._12_4_ = -(uint)(auVar43._12_4_ == iVar30);
            auVar61._0_4_ = auVar61._4_4_;
            auVar61._8_4_ = auVar61._12_4_;
            auVar67._0_4_ = auVar67._4_4_;
            auVar67._8_4_ = auVar67._12_4_;
            auVar43 = auVar61 & auVar52 | auVar67;
            auVar43 = packssdw(auVar43,auVar43);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar43 = packssdw(auVar43 ^ auVar7,auVar43 ^ auVar7);
            if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar26 + -10 + uVar24 * 2) = uVar2;
            }
            auVar36 = pshufhw(auVar52,auVar52,0x84);
            auVar65 = pshufhw(auVar61,auVar61,0x84);
            auVar47 = pshufhw(auVar36,auVar67,0x84);
            auVar53._8_4_ = 0xffffffff;
            auVar53._0_8_ = 0xffffffffffffffff;
            auVar53._12_4_ = 0xffffffff;
            auVar53 = (auVar47 | auVar65 & auVar36) ^ auVar53;
            auVar36 = packssdw(auVar53,auVar53);
            if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar26 + -8 + uVar24 * 2) = uVar2;
            }
            auVar36 = (auVar33 | auVar12) ^ auVar15;
            iVar58 = -(uint)(iVar45 < auVar36._0_4_);
            auVar55._4_4_ = -(uint)(iVar29 < auVar36._4_4_);
            iVar64 = -(uint)(iVar57 < auVar36._8_4_);
            auVar55._12_4_ = -(uint)(iVar30 < auVar36._12_4_);
            auVar62._4_4_ = iVar58;
            auVar62._0_4_ = iVar58;
            auVar62._8_4_ = iVar64;
            auVar62._12_4_ = iVar64;
            auVar43 = pshuflw(auVar43,auVar62,0xe8);
            auVar54._4_4_ = -(uint)(auVar36._4_4_ == iVar29);
            auVar54._12_4_ = -(uint)(auVar36._12_4_ == iVar30);
            auVar54._0_4_ = auVar54._4_4_;
            auVar54._8_4_ = auVar54._12_4_;
            auVar35 = pshuflw(auVar38 & auVar35,auVar54,0xe8);
            in_XMM14 = auVar35 & auVar43;
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar35 = pshuflw(auVar43,auVar55,0xe8);
            auVar70._8_4_ = 0xffffffff;
            auVar70._0_8_ = 0xffffffffffffffff;
            auVar70._12_4_ = 0xffffffff;
            auVar70 = (auVar35 | in_XMM14) ^ auVar70;
            in_XMM13 = packssdw(auVar70,auVar70);
            if ((in_XMM13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar26 + -6 + uVar24 * 2) = uVar2;
            }
            auVar55 = auVar54 & auVar62 | auVar55;
            auVar35 = packssdw(auVar55,auVar55);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar8,auVar35 ^ auVar8);
            if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar26 + -4 + uVar24 * 2) = uVar2;
            }
            auVar35 = (auVar33 | auVar11) ^ auVar15;
            auVar63._0_4_ = -(uint)(iVar45 < auVar35._0_4_);
            auVar63._4_4_ = -(uint)(iVar29 < auVar35._4_4_);
            auVar63._8_4_ = -(uint)(iVar57 < auVar35._8_4_);
            auVar63._12_4_ = -(uint)(iVar30 < auVar35._12_4_);
            auVar56._4_4_ = auVar63._0_4_;
            auVar56._0_4_ = auVar63._0_4_;
            auVar56._8_4_ = auVar63._8_4_;
            auVar56._12_4_ = auVar63._8_4_;
            auVar34._4_4_ = -(uint)(auVar35._4_4_ == iVar29);
            auVar34._12_4_ = -(uint)(auVar35._12_4_ == iVar30);
            auVar34._0_4_ = auVar34._4_4_;
            auVar34._8_4_ = auVar34._12_4_;
            auVar44._4_4_ = auVar63._4_4_;
            auVar44._0_4_ = auVar63._4_4_;
            auVar44._8_4_ = auVar63._12_4_;
            auVar44._12_4_ = auVar63._12_4_;
            in_XMM12 = auVar34 & auVar56 | auVar44;
            auVar35 = packssdw(auVar63,in_XMM12);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 ^ auVar9,auVar35 ^ auVar9);
            if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar26 + -2 + uVar24 * 2) = uVar2;
            }
            auVar38 = pshufhw(auVar56,auVar56,0x84);
            auVar35 = pshufhw(auVar34,auVar34,0x84);
            auVar43 = pshufhw(auVar44,auVar44,0x84);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar35 = packssdw(auVar35 & auVar38,(auVar43 | auVar35 & auVar38) ^ auVar10);
            if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar26 + uVar24 * 2) = uVar2;
            }
            uVar24 = uVar24 + 8;
          } while (((lVar22 - lVar20) + 7U & 0xfffffffffffffff8) != uVar24);
        }
        uVar21 = uVar21 + 1;
        lVar18 = lVar18 + lVar16 * 2;
        lVar26 = lVar26 + lVar16 * 2;
      } while (uVar21 != (uint)height);
    }
    if (0 < border_vert) {
      lVar20 = (long)border_horz;
      __src = (void *)(lVar27 + lVar20 * -2);
      sVar19 = (long)(width + border_horz * 2) * 2;
      lVar22 = -(long)border_vert;
      pvVar25 = (void *)(lVar27 - (lVar20 * 2 + border_vert * lVar16 * 2));
      do {
        lVar22 = lVar22 + 1;
        memcpy(pvVar25,__src,sVar19);
        pvVar25 = (void *)((long)pvVar25 + lVar16 * 2);
      } while ((int)lVar22 != 0);
      lVar22 = (long)height;
      pvVar25 = (void *)(lVar27 + lVar16 * lVar22 * 2 + lVar20 * -2);
      do {
        memcpy(pvVar25,(void *)((height + -1) * lVar16 * 2 + (long)__src),sVar19);
        lVar22 = lVar22 + 1;
        pvVar25 = (void *)((long)pvVar25 + lVar16 * 2);
      } while (lVar22 < border_vert + height);
    }
  }
  return;
}

Assistant:

void av1_extend_frame(uint8_t *data, int width, int height, int stride,
                      int border_horz, int border_vert, int highbd) {
#if CONFIG_AV1_HIGHBITDEPTH
  if (highbd) {
    extend_frame_highbd(CONVERT_TO_SHORTPTR(data), width, height, stride,
                        border_horz, border_vert);
    return;
  }
#endif
  (void)highbd;
  extend_frame_lowbd(data, width, height, stride, border_horz, border_vert);
}